

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

VRInputDevice * __thiscall
MinVR::VRSpecificItemFactory<MinVR::VRInputDevice>::create
          (VRSpecificItemFactory<MinVR::VRInputDevice> *this,VRMainInterface *vrMain,
          VRDataIndex *config,string *dataContainer)

{
  bool bVar1;
  VRInputDevice *pVVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  string *unaff_retaddr;
  VRDataIndex *in_stack_00000008;
  string type;
  string attributeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string local_68 [32];
  string local_48 [32];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  string *in_stack_fffffffffffffff8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  VRInputDevice::getAttributeName_abi_cxx11_();
  VRDataIndex::getAttributeValue(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
  bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    pVVar2 = (VRInputDevice *)0x0;
  }
  else {
    pVVar2 = (VRInputDevice *)(**(code **)(*in_RDI + 0x20))(in_RDI,local_18,local_20,local_28);
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return pVVar2;
}

Assistant:

virtual T* create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {
		std::string attributeName = T::getAttributeName();

		std::string type = config->getAttributeValue(dataContainer, attributeName);

		if (type != _typeName) {
			// This factory cannot create the type specified
			return NULL;
		}

		return createConcrete(vrMain, config, dataContainer);
	}